

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_json.hpp
# Opt level: O0

bool __thiscall
jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_bignum
          (basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this)

{
  json_storage_kind jVar1;
  const_pointer s;
  size_type length;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_RDI;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_00000020;
  string_view_type local_30;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *local_20;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *this_00;
  bool local_1;
  
  this_00 = local_20;
  jVar1 = storage_kind(in_RDI);
  switch(jVar1) {
  case int64:
  case uint64:
    local_1 = true;
    break;
  default:
    local_1 = false;
    break;
  case short_str:
  case long_str:
    _local_20 = as_string_view(in_stack_00000020);
    s = std::basic_string_view<char,_std::char_traits<char>_>::data
                  ((basic_string_view<char,_std::char_traits<char>_> *)&local_20);
    local_30 = as_string_view(in_stack_00000020);
    length = std::basic_string_view<char,_std::char_traits<char>_>::length(&local_30);
    local_1 = detail::is_base10<char>(s,length);
    break;
  case json_reference:
    basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::
    cast<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>::json_reference_storage>
              (in_RDI);
    json_reference_storage::value((json_reference_storage *)0xba9e4c);
    local_1 = is_bignum(this_00);
  }
  return local_1;
}

Assistant:

bool is_bignum() const
        {
            switch (storage_kind())
            {
                case json_storage_kind::short_str:
                case json_storage_kind::long_str:
                    return jsoncons::detail::is_base10(as_string_view().data(), as_string_view().length());
                case json_storage_kind::int64:
                case json_storage_kind::uint64:
                    return true;
                case json_storage_kind::json_reference:
                    return cast<json_reference_storage>().value().is_bignum();
                default:
                    return false;
            }
        }